

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgt.c
# Opt level: O1

opj_tgt_tree_t *
opj_tgt_init(opj_tgt_tree_t *p_tree,OPJ_UINT32 p_num_leafs_h,OPJ_UINT32 p_num_leafs_v,
            opj_event_mgr_t *p_manager)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  opj_tgt_node *poVar3;
  OPJ_UINT32 OVar4;
  opj_tgt_node_t *poVar5;
  uint uVar6;
  opj_tgt_node *poVar7;
  OPJ_UINT32 *pOVar8;
  ulong uVar9;
  opj_tgt_node *poVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  OPJ_INT32 l_nplv [32];
  OPJ_INT32 l_nplh [32];
  OPJ_UINT32 local_128 [32];
  OPJ_UINT32 local_a8 [32];
  
  if (p_tree == (opj_tgt_tree_t *)0x0) {
LAB_0013a6a7:
    p_tree = (opj_tgt_tree_t *)0x0;
  }
  else {
    if ((p_tree->numleafsh != p_num_leafs_h) || (p_tree->numleafsv != p_num_leafs_v)) {
      p_tree->numleafsh = p_num_leafs_h;
      p_tree->numleafsv = p_num_leafs_v;
      local_a8[0] = p_num_leafs_h;
      local_128[0] = p_num_leafs_v;
      p_tree->numnodes = 0;
      OVar4 = 0;
      uVar12 = 0xffffffff;
      do {
        iVar13 = (int)uVar12;
        uVar11 = iVar13 + 1;
        uVar12 = (ulong)uVar11;
        OVar1 = local_a8[uVar12];
        OVar2 = local_128[uVar12];
        uVar6 = iVar13 + 2;
        local_a8[uVar6] = (int)((OVar1 - ((int)(OVar1 + 1) >> 0x1f)) + 1) >> 1;
        local_128[uVar6] = (int)((OVar2 - ((int)(OVar2 + 1) >> 0x1f)) + 1) >> 1;
        OVar4 = OVar4 + OVar2 * OVar1;
      } while (1 < OVar2 * OVar1);
      p_tree->numnodes = OVar4;
      if (OVar4 == 0) {
        opj_tgt_destroy(p_tree);
        goto LAB_0013a6a7;
      }
      uVar6 = OVar4 * 0x18;
      if (p_tree->nodes_size < uVar6) {
        poVar5 = (opj_tgt_node_t *)opj_realloc(p_tree->nodes,(ulong)uVar6);
        if (poVar5 == (opj_tgt_node_t *)0x0) {
          opj_event_msg(p_manager,1,"Not enough memory to reinitialize the tag tree\n");
          opj_tgt_destroy(p_tree);
          goto LAB_0013a6a7;
        }
        p_tree->nodes = poVar5;
        memset((void *)((long)&poVar5->parent + (ulong)p_tree->nodes_size),0,
               (ulong)(uVar6 - p_tree->nodes_size));
        p_tree->nodes_size = uVar6;
      }
      poVar5 = p_tree->nodes;
      if (uVar11 != 0) {
        poVar7 = poVar5 + p_tree->numleafsv * p_tree->numleafsh;
        uVar9 = 0;
        poVar10 = poVar7;
        do {
          OVar4 = local_128[uVar9];
          if (0 < (int)OVar4) {
            OVar1 = local_a8[uVar9];
            uVar6 = 0;
            do {
              iVar13 = OVar1 + 2;
              if (0 < (int)OVar1) {
                do {
                  poVar5->parent = poVar7;
                  if (iVar13 == 3) {
                    poVar5 = poVar5 + 1;
                  }
                  else {
                    poVar5[1].parent = poVar7;
                    poVar5 = poVar5 + 2;
                  }
                  poVar7 = poVar7 + 1;
                  iVar13 = iVar13 + -2;
                } while (2 < iVar13);
              }
              poVar3 = poVar7;
              if (uVar6 != OVar4 - 1 && (uVar6 & 1) == 0) {
                poVar7 = poVar10;
                poVar3 = poVar10 + (int)OVar1;
              }
              poVar10 = poVar3;
              uVar6 = uVar6 + 1;
            } while (uVar6 != OVar4);
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 != uVar12);
      }
      poVar5->parent = (opj_tgt_node *)0x0;
    }
    OVar4 = p_tree->numnodes;
    if (OVar4 != 0) {
      pOVar8 = &p_tree->nodes->known;
      do {
        *(undefined8 *)(pOVar8 + -2) = 999;
        *pOVar8 = 0;
        pOVar8 = pOVar8 + 6;
        OVar4 = OVar4 - 1;
      } while (OVar4 != 0);
    }
  }
  return p_tree;
}

Assistant:

opj_tgt_tree_t *opj_tgt_init(opj_tgt_tree_t * p_tree, OPJ_UINT32 p_num_leafs_h,
                             OPJ_UINT32 p_num_leafs_v, opj_event_mgr_t *p_manager)
{
    OPJ_INT32 l_nplh[32];
    OPJ_INT32 l_nplv[32];
    opj_tgt_node_t *l_node = 00;
    opj_tgt_node_t *l_parent_node = 00;
    opj_tgt_node_t *l_parent_node0 = 00;
    OPJ_UINT32 i;
    OPJ_INT32 j, k;
    OPJ_UINT32 l_num_levels;
    OPJ_UINT32 n;
    OPJ_UINT32 l_node_size;

    if (! p_tree) {
        return 00;
    }

    if ((p_tree->numleafsh != p_num_leafs_h) ||
            (p_tree->numleafsv != p_num_leafs_v)) {
        p_tree->numleafsh = p_num_leafs_h;
        p_tree->numleafsv = p_num_leafs_v;

        l_num_levels = 0;
        l_nplh[0] = (OPJ_INT32)p_num_leafs_h;
        l_nplv[0] = (OPJ_INT32)p_num_leafs_v;
        p_tree->numnodes = 0;
        do {
            n = (OPJ_UINT32)(l_nplh[l_num_levels] * l_nplv[l_num_levels]);
            l_nplh[l_num_levels + 1] = (l_nplh[l_num_levels] + 1) / 2;
            l_nplv[l_num_levels + 1] = (l_nplv[l_num_levels] + 1) / 2;
            p_tree->numnodes += n;
            ++l_num_levels;
        } while (n > 1);

        /* ADD */
        if (p_tree->numnodes == 0) {
            opj_tgt_destroy(p_tree);
            return 00;
        }
        l_node_size = p_tree->numnodes * (OPJ_UINT32)sizeof(opj_tgt_node_t);

        if (l_node_size > p_tree->nodes_size) {
            opj_tgt_node_t* new_nodes = (opj_tgt_node_t*) opj_realloc(p_tree->nodes,
                                        l_node_size);
            if (! new_nodes) {
                opj_event_msg(p_manager, EVT_ERROR,
                              "Not enough memory to reinitialize the tag tree\n");
                opj_tgt_destroy(p_tree);
                return 00;
            }
            p_tree->nodes = new_nodes;
            memset(((char *) p_tree->nodes) + p_tree->nodes_size, 0,
                   l_node_size - p_tree->nodes_size);
            p_tree->nodes_size = l_node_size;
        }
        l_node = p_tree->nodes;
        l_parent_node = &p_tree->nodes[p_tree->numleafsh * p_tree->numleafsv];
        l_parent_node0 = l_parent_node;

        for (i = 0; i < l_num_levels - 1; ++i) {
            for (j = 0; j < l_nplv[i]; ++j) {
                k = l_nplh[i];
                while (--k >= 0) {
                    l_node->parent = l_parent_node;
                    ++l_node;
                    if (--k >= 0) {
                        l_node->parent = l_parent_node;
                        ++l_node;
                    }
                    ++l_parent_node;
                }
                if ((j & 1) || j == l_nplv[i] - 1) {
                    l_parent_node0 = l_parent_node;
                } else {
                    l_parent_node = l_parent_node0;
                    l_parent_node0 += l_nplh[i];
                }
            }
        }
        l_node->parent = 0;
    }
    opj_tgt_reset(p_tree);

    return p_tree;
}